

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<capnp::Text::Reader,kj::StringPtr&>
          (StringTree *__return_storage_ptr__,kj *this,Reader *params,StringPtr *params_1)

{
  ArrayPtr<const_char> local_28;
  size_t local_18;
  char *local_10;
  
  local_18 = *(size_t *)this;
  local_10 = (char *)(*(long *)(this + 8) + -1);
  local_28.ptr = (params->super_StringPtr).content.ptr;
  local_28.size_ = (params->super_StringPtr).content.size_ - 1;
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&stack0xffffffffffffffe8,&local_28,
             (ArrayPtr<const_char> *)local_28.size_);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}